

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O3

int32 bio_fread(void *buf,int32 el_sz,int32 n_el,FILE *fp,int32 swap,uint32 *chksum)

{
  uint32 uVar1;
  int32 iVar2;
  size_t sVar3;
  
  sVar3 = fread(buf,(long)el_sz,(long)n_el,(FILE *)fp);
  iVar2 = -1;
  if (sVar3 == (long)n_el) {
    if (swap != 0) {
      swap_buf(buf,el_sz,n_el);
    }
    iVar2 = n_el;
    if (chksum != (uint32 *)0x0) {
      uVar1 = chksum_accum(buf,el_sz,n_el,*chksum);
      *chksum = uVar1;
    }
  }
  return iVar2;
}

Assistant:

int32
bio_fread(void *buf, int32 el_sz, int32 n_el, FILE * fp, int32 swap,
          uint32 * chksum)
{
    if (fread(buf, el_sz, n_el, fp) != (size_t) n_el)
        return -1;

    if (swap)
        swap_buf(buf, el_sz, n_el);

    if (chksum)
        *chksum = chksum_accum(buf, el_sz, n_el, *chksum);

    return n_el;
}